

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O2

SourceDynamicProfileManager *
Js::SourceDynamicProfileManager::Deserialize<Js::BufferReader>
          (BufferReader *reader,Recycler *recycler)

{
  BVIndex length;
  code *pcVar1;
  bool bVar2;
  BVFixed *ptr;
  size_t len;
  ThreadContext *pTVar3;
  Recycler *alloc;
  SourceDynamicProfileManager *this;
  undefined4 *puVar4;
  uint uVar5;
  uint lineNumber;
  undefined1 local_70 [8];
  TrackAllocData data;
  uint local_3c;
  BVIndex local_38;
  uint profileCount;
  LocalFunctionId functionId;
  
  if (reader->lengthLeft < 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    lineNumber = 0x145;
  }
  else {
    length = *(BVIndex *)reader->current;
    ptr = BVFixed::New<Memory::Recycler>(length,recycler,false);
    local_38 = length;
    len = BVFixed::GetAllocSize(length);
    bVar2 = BufferReader::ReadArray<char>(reader,(char *)ptr,len);
    if (bVar2) {
      bVar2 = BufferReader::Read<unsigned_int>(reader,&local_3c);
      if (bVar2) {
        pTVar3 = ThreadContext::GetContextForCurrentThread();
        local_70 = (undefined1  [8])&typeinfo;
        data.typeinfo = (type_info *)0x0;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_57ade96;
        data.filename._0_4_ = 0x15b;
        alloc = Memory::Recycler::TrackAllocInfo(pTVar3->recycler,(TrackAllocData *)local_70);
        uVar5 = 0;
        this = (SourceDynamicProfileManager *)new<Memory::Recycler>(0x98,alloc,0x37a1d4);
        data._32_8_ = recycler;
        SourceDynamicProfileManager(this,recycler);
        Memory::WriteBarrierPtr<const_BVFixed>::WriteBarrierSet(&this->cachedStartupFunctions,ptr);
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01433318,DynamicProfilePhase);
        if (bVar2) {
          Output::Print(L"Loaded: Startup functions bit vector:");
          BVFixed::Dump(ptr);
        }
        while( true ) {
          if (local_3c <= uVar5) {
            return this;
          }
          local_70 = (undefined1  [8])
                     DynamicProfileInfo::Deserialize<Js::BufferReader>
                               (reader,(Recycler *)data._32_8_,&profileCount);
          if ((local_70 == (undefined1  [8])0x0) || (local_38 <= profileCount)) break;
          JsUtil::
          BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<unsigned_int,Js::DynamicProfileInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&this->dynamicProfileInfoMap,&profileCount,(DynamicProfileInfo **)local_70);
          AddSavingItem(this,profileCount,(DynamicProfileInfo *)local_70);
          uVar5 = uVar5 + 1;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        lineNumber = 0x16d;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        lineNumber = 0x155;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      lineNumber = 0x14d;
    }
  }
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                              ,lineNumber,"(false)","false");
  if (bVar2) {
    *puVar4 = 0;
    return (SourceDynamicProfileManager *)0x0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

SourceDynamicProfileManager *
    SourceDynamicProfileManager::Deserialize(T * reader, Recycler* recycler)
    {
        uint functionCount;
        if (!reader->Peek(&functionCount))
        {
            Assert(false);
            return nullptr;
        }

        BVFixed * startupFunctions = BVFixed::New(functionCount, recycler);
        if (!reader->ReadArray(((char *)startupFunctions),
            BVFixed::GetAllocSize(functionCount)))
        {
            Assert(false);
            return nullptr;
        }

        uint profileCount;

        if (!reader->Read(&profileCount))
        {
            Assert(false);
            return nullptr;
        }

        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();

        SourceDynamicProfileManager * sourceDynamicProfileManager = RecyclerNew(threadContext->GetRecycler(), SourceDynamicProfileManager, recycler);

        sourceDynamicProfileManager->cachedStartupFunctions = startupFunctions;

#if DBG_DUMP
        if(Configuration::Global.flags.Dump.IsEnabled(DynamicProfilePhase))
        {
            Output::Print(_u("Loaded: Startup functions bit vector:"));
            startupFunctions->Dump();
        }
#endif

        for (uint i = 0; i < profileCount; i++)
        {
            Js::LocalFunctionId functionId;
            DynamicProfileInfo * dynamicProfileInfo = DynamicProfileInfo::Deserialize(reader, recycler, &functionId);
            if (dynamicProfileInfo == nullptr || functionId >= functionCount)
            {
                Assert(false);
                return nullptr;
            }
            sourceDynamicProfileManager->dynamicProfileInfoMap.Add(functionId, dynamicProfileInfo);
            sourceDynamicProfileManager->AddSavingItem(functionId, dynamicProfileInfo);
        }
        return sourceDynamicProfileManager;
    }